

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O1

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               *src)

{
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar1;
  RHS_ref_type pmVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_30;
  
  pfVar4 = dest->ptr;
  pmVar1 = src->lhs;
  pfVar5 = (pmVar1->op).ptr;
  if (((pfVar4 != pfVar5) && (pfVar4 != (src->rhs->lhs->op).ptr)) &&
     ((pmVar2 = src->rhs->rhs, (pmVar2->data).nc_ == 0 || (pmVar2->data).nr_ == 0 ||
      (pfVar4 != (pmVar2->data).data)))) {
    lVar3 = (pmVar1->op).rows;
    if (0 < lVar3) {
      lVar8 = (pmVar1->op).cols;
      lVar10 = (pmVar1->op).stride;
      lVar7 = dest->width;
      lVar6 = 0;
      do {
        if (0 < lVar8) {
          lVar9 = 0;
          do {
            pfVar4[lVar9] = pfVar5[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
        }
        lVar6 = lVar6 + 1;
        pfVar4 = pfVar4 + lVar7;
        pfVar5 = pfVar5 + lVar10;
      } while (lVar6 != lVar3);
    }
    default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
              (dest,src->rhs->lhs,src->rhs->rhs);
    return;
  }
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
  matrix(&local_30,dest->height,dest->width);
  pmVar1 = src->lhs;
  lVar3 = (pmVar1->op).rows;
  if (0 < lVar3) {
    pfVar4 = (pmVar1->op).ptr;
    lVar8 = (pmVar1->op).cols;
    lVar10 = (pmVar1->op).stride;
    lVar7 = 0;
    pfVar5 = local_30.data.data;
    do {
      if (0 < lVar8) {
        lVar6 = 0;
        do {
          pfVar5[lVar6] = pfVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar8 != lVar6);
      }
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + local_30.data.nc_;
      pfVar4 = pfVar4 + lVar10;
    } while (lVar7 != lVar3);
  }
  default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
            (&local_30,src->rhs->lhs,src->rhs->rhs);
  if (0 < local_30.data.nr_) {
    pfVar4 = dest->ptr;
    lVar3 = dest->width;
    lVar8 = 0;
    pfVar5 = local_30.data.data;
    do {
      if (0 < local_30.data.nc_) {
        lVar10 = 0;
        do {
          pfVar4[lVar10] = pfVar5[lVar10];
          lVar10 = lVar10 + 1;
        } while (local_30.data.nc_ != lVar10);
      }
      lVar8 = lVar8 + 1;
      pfVar4 = pfVar4 + lVar3;
      pfVar5 = pfVar5 + local_30.data.nc_;
    } while (lVar8 != local_30.data.nr_);
  }
  if (local_30.data.data != (float *)0x0) {
    operator_delete__(local_30.data.data);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }